

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstreambuf.cpp
# Opt level: O0

void __thiscall
sai::ifstreambuf::ifstreambuf(ifstreambuf *this,span<const_unsigned_int,_256UL> DecryptionKey)

{
  unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_> local_38;
  unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_> local_30 [3];
  ifstreambuf *local_18;
  ifstreambuf *this_local;
  span<const_unsigned_int,_256UL> DecryptionKey_local;
  
  local_18 = this;
  this_local = (ifstreambuf *)DecryptionKey._M_ptr;
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__ifstreambuf_0011dd20;
  std::ifstream::ifstream(&this->FileIn);
  (this->Key)._M_ptr = (pointer)this_local;
  this->CurrentPage = 0xffffffff;
  std::unique_ptr<sai::VirtualPage,std::default_delete<sai::VirtualPage>>::
  unique_ptr<std::default_delete<sai::VirtualPage>,void>
            ((unique_ptr<sai::VirtualPage,std::default_delete<sai::VirtualPage>> *)&this->PageCache)
  ;
  this->PageCacheIndex = 0xffffffff;
  std::unique_ptr<sai::VirtualPage,std::default_delete<sai::VirtualPage>>::
  unique_ptr<std::default_delete<sai::VirtualPage>,void>
            ((unique_ptr<sai::VirtualPage,std::default_delete<sai::VirtualPage>> *)&this->TableCache
            );
  this->TableCacheIndex = 0xffffffff;
  this->PageCount = 0;
  std::streambuf::setg((char *)this,(char *)0x0,(char *)0x0);
  std::streambuf::setp((char *)this,(char *)0x0);
  std::make_unique<sai::VirtualPage>();
  std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::operator=
            (&this->PageCache,local_30);
  std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::~unique_ptr(local_30);
  std::make_unique<sai::VirtualPage>();
  std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::operator=
            (&this->TableCache,&local_38);
  std::unique_ptr<sai::VirtualPage,_std::default_delete<sai::VirtualPage>_>::~unique_ptr(&local_38);
  return;
}

Assistant:

ifstreambuf::ifstreambuf(std::span<const std::uint32_t, 256> DecryptionKey) : Key(DecryptionKey)
{
	setg(nullptr, nullptr, nullptr);
	setp(nullptr, nullptr);

	PageCache  = std::make_unique<VirtualPage>();
	TableCache = std::make_unique<VirtualPage>();
}